

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file.cpp
# Opt level: O2

string * __thiscall cppcms::http::file::mime_abi_cxx11_(string *__return_storage_ptr__,file *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->mime_);
  return __return_storage_ptr__;
}

Assistant:

std::string file::mime() const
{
	return mime_;
}